

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O1

void __thiscall
QTextDocumentLayoutPrivate::drawTableCell
          (QTextDocumentLayoutPrivate *this,QRectF *cellRect,QPainter *painter,
          PaintContext *cell_context,QTextTable *table,QTextTableData *td,int r,int c,
          QTextBlock *cursorBlockNeedingRepaint,QPointF *cursorBlockOffset)

{
  QTextFrame **ppQVar1;
  Iterator it;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  QFixed QVar8;
  QFixed QVar9;
  int iVar10;
  int iVar11;
  BorderStyle style;
  QBrush *other;
  QPen *p;
  QPoint QVar12;
  int iVar13;
  long in_FS_OFFSET;
  double bottomMargin;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  QTextFrame **ppQVar17;
  double dVar19;
  undefined1 auVar18 [16];
  int iVar28;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  QTextFrame **ppQVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  QSizeF QVar27;
  QBrush oldBrush;
  QBrush bg;
  QPen oldPen;
  double local_178;
  int local_11c;
  QBrush local_118;
  QBrush local_110;
  QPointF local_108;
  undefined1 local_f0 [8];
  iterator local_e8;
  QRectF local_c8;
  undefined1 local_a8 [8];
  qreal qStack_a0;
  undefined1 local_98 [24];
  double dStack_80;
  QTextFormat local_78;
  QTextFormat local_68;
  QTextFormat local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextTable::cellAt((QTextTable *)local_48,(int)table,r);
  iVar6 = QTextTableCell::rowSpan((QTextTableCell *)local_48);
  iVar7 = QTextTableCell::columnSpan((QTextTableCell *)local_48);
  if (((iVar6 != 1) && (iVar6 = QTextTableCell::row((QTextTableCell *)local_48), iVar6 != r)) ||
     ((iVar7 != 1 && (iVar6 = QTextTableCell::column((QTextTableCell *)local_48), iVar6 != c))))
  goto LAB_004eea4f;
  QVar8 = QTextTableData::leftPadding(td,table,(QTextTableCell *)local_48);
  QVar9 = QTextTableData::topPadding(td,table,(QTextTableCell *)local_48);
  iVar13 = (td->super_QTextFrameData).border.val + (td->cellSpacing).val;
  local_178 = (double)((td->super_QTextFrameData).effectiveTopMargin.val + iVar13) * 0.015625;
  iVar6 = (td->super_QTextFrameData).effectiveBottomMargin.val;
  QTextTable::format((QTextTable *)local_98);
  iVar10 = QTextFormat::intProperty((QTextFormat *)local_98,0x4104);
  iVar11 = QTextTable::rows(table);
  iVar7 = iVar11 + -1;
  if (iVar10 < iVar11 + -1) {
    iVar7 = iVar10;
  }
  QTextFormat::~QTextFormat((QTextFormat *)local_98);
  if (iVar7 <= r) {
    local_178 = local_178 + (double)(td->headerHeight).val * 0.015625;
  }
  QTextTableCell::format((QTextTableCell *)local_98);
  bVar3 = QTextFormat::hasProperty((QTextFormat *)local_98,0x4818);
  bVar5 = true;
  if (bVar3) {
LAB_004ee28c:
    bVar4 = false;
    bVar2 = false;
  }
  else {
    QTextTableCell::format((QTextTableCell *)&local_58);
    bVar4 = QTextFormat::hasProperty(&local_58,0x4816);
    if (bVar4) goto LAB_004ee28c;
    QTextTableCell::format((QTextTableCell *)&local_68);
    bVar5 = QTextFormat::hasProperty(&local_68,0x4819);
    if (bVar5) {
      bVar2 = true;
      bVar4 = false;
      bVar5 = true;
    }
    else {
      QTextTableCell::format((QTextTableCell *)&local_78);
      bVar5 = QTextFormat::hasProperty(&local_78,0x4817);
      bVar4 = true;
      bVar2 = true;
    }
  }
  if (bVar4) {
    QTextFormat::~QTextFormat(&local_78);
  }
  if (bVar2) {
    QTextFormat::~QTextFormat(&local_68);
  }
  if (!bVar3) {
    QTextFormat::~QTextFormat(&local_58);
  }
  bottomMargin = (double)(iVar13 + iVar6) * 0.015625;
  QTextFormat::~QTextFormat((QTextFormat *)local_98);
  if ((td->borderCollapse == false) &&
     ((td->super_QTextFrameData).border.val != 0 && bVar5 == false)) {
    local_108.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    other = QPainter::brush(painter);
    QBrush::QBrush((QBrush *)&local_108,other);
    local_a8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    p = QPainter::pen(painter);
    QPen::QPen((QPen *)local_a8,p);
    local_98._0_8_ = cellRect->xp + -1.0;
    local_98._8_8_ = cellRect->yp + -1.0;
    dStack_80 = cellRect->h + 1.0;
    local_98._16_8_ = cellRect->w + 1.0;
    QTextTable::format((QTextTable *)&local_c8);
    style = QTextFormat::intProperty((QTextFormat *)&local_c8,0x4010);
    QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
    if (style - BorderStyle_Groove < 4) {
      style = *(BorderStyle *)(&DAT_006bc620 + (ulong)(style - BorderStyle_Groove) * 4);
    }
    QTextTable::format((QTextTable *)&local_c8);
    QTextFormat::brushProperty((QTextFormat *)local_f0,(int)&local_c8);
    drawBorder(this,painter,(QRectF *)local_98,local_178,bottomMargin,1.0,(QBrush *)local_f0,style);
    QBrush::~QBrush((QBrush *)local_f0);
    QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
    QPainter::setBrush(painter,(QBrush *)&local_108);
    QPainter::setPen(painter,(QPen *)local_a8);
    QPen::~QPen((QPen *)local_a8);
    QBrush::~QBrush((QBrush *)&local_108);
  }
  local_f0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QTextTableCell::format((QTextTableCell *)local_98);
  QTextFormat::brushProperty((QTextFormat *)local_f0,(int)(QTextFormat *)local_98);
  QTextFormat::~QTextFormat((QTextFormat *)local_98);
  local_108.xp = -NAN;
  local_108.yp = -NAN;
  QVar12 = QPainter::brushOrigin(painter);
  local_108.xp = (qreal)QVar12.xp.m_i.m_i;
  local_108.yp = (qreal)QVar12.yp.m_i.m_i;
  if (*(int *)((long)local_f0 + 4) != 0) {
    QVar27 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
    dVar15 = QVar27.ht;
    iVar7 = 0;
    iVar6 = iVar7;
    if (0.0 < dVar15) {
      iVar7 = (int)((cellRect->yp + cellRect->h) / dVar15);
      iVar6 = (int)(cellRect->yp / dVar15);
    }
    if (iVar6 == iVar7) {
      QBrush::QBrush(&local_110,(QBrush *)local_f0);
      local_c8.xp = cellRect->xp;
      local_c8.yp = cellRect->yp;
      stack0xffffffffffffff78 = ZEXT816(0);
      local_98._0_8_ = (QTextFormatPrivate *)0x0;
      local_98._8_8_ = (QTextFrame **)0x0;
      fillBackground(painter,cellRect,&local_110,(QPointF *)&local_c8,(QRectF *)local_98);
      QBrush::~QBrush(&local_110);
    }
    else if (iVar6 <= iVar7) {
      iVar10 = iVar6;
      do {
        dVar16 = cellRect->xp;
        dVar19 = cellRect->yp;
        auVar14._0_8_ = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
        auVar14._8_8_ = (double)((ulong)dVar19 & 0x8000000000000000 | 0x3fe0000000000000) + dVar19;
        auVar24._8_8_ = 0x41dfffffffc00000;
        auVar24._0_8_ = 0x41dfffffffc00000;
        auVar25 = minpd(auVar24,auVar14);
        auVar26._8_8_ = 0xc1e0000000000000;
        auVar26._0_8_ = 0xc1e0000000000000;
        auVar26 = maxpd(auVar25,auVar26);
        iVar11 = (int)auVar26._0_8_;
        iVar13 = (int)auVar26._8_8_;
        local_98._0_8_ = (undefined8)iVar11;
        local_98._8_8_ = (undefined8)iVar13;
        dVar16 = (dVar16 - (double)iVar11) * 0.5 + cellRect->w;
        dVar19 = (dVar19 - (double)local_98._8_8_) * 0.5 + cellRect->h;
        auVar21._0_8_ = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
        auVar21._8_8_ = (double)((ulong)dVar19 & 0x8000000000000000 | 0x3fe0000000000000) + dVar19;
        auVar18._8_8_ = 0x41dfffffffc00000;
        auVar18._0_8_ = 0x41dfffffffc00000;
        auVar26 = minpd(auVar18,auVar21);
        auVar25._8_8_ = 0xc1e0000000000000;
        auVar25._0_8_ = 0xc1e0000000000000;
        auVar26 = maxpd(auVar26,auVar25);
        iVar28 = iVar11 + -1 + (int)auVar26._0_8_;
        auVar22._4_4_ = iVar13 + -1 + (int)auVar26._8_8_;
        auVar22._8_4_ = auVar22._4_4_;
        auVar22._12_4_ = -(uint)(auVar22._4_4_ < 0);
        local_98._16_8_ =
             (undefined8)
             ((CONCAT44(-(uint)(iVar28 < 0),iVar28) - CONCAT44(-(uint)(iVar11 < 0),iVar11)) + 1);
        dVar16 = (double)((auVar22._8_8_ - CONCAT44(-(uint)(iVar13 < 0),iVar13)) + 1);
        unique0x10000355 = SUB84(dVar16,0);
        unique0x10000359 = (int)((ulong)dVar16 >> 0x20);
        if (iVar6 != iVar7) {
          ppQVar17 = (QTextFrame **)((double)iVar10 * dVar15 + local_178);
          ppQVar1 = (QTextFrame **)(cell_context->clip).yp;
          ppQVar23 = ppQVar1;
          if ((double)ppQVar1 <= (double)ppQVar17) {
            ppQVar23 = ppQVar17;
          }
          dVar20 = (double)ppQVar1 + (cell_context->clip).h;
          dVar19 = (double)(iVar10 + 1) * dVar15 + -bottomMargin;
          if (dVar20 <= dVar19) {
            dVar19 = dVar20;
          }
          if ((double)ppQVar23 <= (double)local_98._8_8_) {
            ppQVar23 = (QTextFrame **)local_98._8_8_;
          }
          dVar20 = (double)ppQVar23 - (double)local_98._8_8_;
          local_98._8_8_ = (double)local_98._8_8_ + dVar20;
          dVar16 = (dVar16 - dVar20) + (double)local_98._8_8_;
          if (dVar19 <= dVar16) {
            dVar16 = dVar19;
          }
          dStack_80 = dVar16 - (double)local_98._8_8_;
          if ((double)local_98._8_8_ < (dVar16 - (double)local_98._8_8_) + (double)local_98._8_8_) {
            QBrush::QBrush(&local_118,(QBrush *)local_f0);
            local_a8 = (undefined1  [8])cellRect->xp;
            qStack_a0 = cellRect->yp;
            local_c8.w = 0.0;
            local_c8.h = 0.0;
            local_c8.xp = 0.0;
            local_c8.yp = 0.0;
            fillBackground(painter,(QRectF *)local_98,&local_118,(QPointF *)local_a8,&local_c8);
            QBrush::~QBrush(&local_118);
          }
        }
        iVar10 = iVar10 + 1;
      } while (iVar7 + 1 != iVar10);
    }
    if (1 < *(int *)((long)local_f0 + 4)) {
      local_98._0_8_ = cellRect->xp;
      local_98._8_8_ = cellRect->yp;
      QPainter::setBrushOrigin(painter,(QPointF *)local_98);
    }
  }
  if (bVar5 != false) {
    drawTableCellBorder(this,cellRect,painter,table,td,(QTextTableCell *)local_48);
  }
  iVar6 = QTextTable::columns(table);
  local_c8.xp = (double)QVar8.val * 0.015625 + cellRect->xp;
  local_c8.yp = (double)(QVar9.val + (td->cellVerticalOffsets).d.ptr[iVar6 * r + c].val) * 0.015625
                + cellRect->yp;
  local_a8 = (undefined1  [8])0x0;
  qStack_a0 = -3.720660661677042e-103;
  QTextTableCell::begin(&local_e8,(QTextTableCell *)local_48);
  iVar6 = QTextTable::rows(table);
  local_11c = iVar6 * c + r;
  QMultiHash<int,_QTextFrame_*>::valuesImpl<int>
            ((QList<QTextFrame_*> *)local_98,&td->childFrameMap,&local_11c);
  it.b = local_e8.b;
  it.e = local_e8.e;
  it.f = local_e8.f;
  it.cf = local_e8.cf;
  it.cb = local_e8.cb;
  it._28_4_ = local_e8._28_4_;
  drawFlow(this,(QPointF *)&local_c8,painter,cell_context,it,(QList<QTextFrame_*> *)local_98,
           (QTextBlock *)local_a8);
  if ((QTextFormatPrivate *)local_98._0_8_ != (QTextFormatPrivate *)0x0) {
    LOCK();
    *(int *)local_98._0_8_ = *(int *)local_98._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_98._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,8,0x10);
    }
  }
  bVar3 = QTextBlock::isValid((QTextBlock *)local_a8);
  if (bVar3) {
    cursorBlockNeedingRepaint->p = (QTextDocumentPrivate *)local_a8;
    cursorBlockNeedingRepaint->n = qStack_a0._0_4_;
    cursorBlockOffset->xp = local_c8.xp;
    cursorBlockOffset->yp = local_c8.yp;
  }
  if (1 < *(int *)((long)local_f0 + 4)) {
    QPainter::setBrushOrigin(painter,&local_108);
  }
  QBrush::~QBrush((QBrush *)local_f0);
LAB_004eea4f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentLayoutPrivate::drawTableCell(const QRectF &cellRect, QPainter *painter, const QAbstractTextDocumentLayout::PaintContext &cell_context,
                                               QTextTable *table, QTextTableData *td, int r, int c,
                                               QTextBlock *cursorBlockNeedingRepaint, QPointF *cursorBlockOffset) const
{
    QTextTableCell cell = table->cellAt(r, c);
    int rspan = cell.rowSpan();
    int cspan = cell.columnSpan();
    if (rspan != 1) {
        int cr = cell.row();
        if (cr != r)
            return;
    }
    if (cspan != 1) {
        int cc = cell.column();
        if (cc != c)
            return;
    }

    const QFixed leftPadding = td->leftPadding(table, cell);
    const QFixed topPadding = td->topPadding(table, cell);

    qreal topMargin = (td->effectiveTopMargin + td->cellSpacing + td->border).toReal();
    qreal bottomMargin = (td->effectiveBottomMargin + td->cellSpacing + td->border).toReal();

    const int headerRowCount = qMin(table->format().headerRowCount(), table->rows() - 1);
    if (r >= headerRowCount)
        topMargin += td->headerHeight.toReal();

    // If cell border configured, don't draw default border for cells. It will be taken care later by
    // drawTableCellBorder().
    bool cellBorderConfigured = (cell.format().hasProperty(QTextFormat::TableCellLeftBorder) ||
                                 cell.format().hasProperty(QTextFormat::TableCellTopBorder) ||
                                 cell.format().hasProperty(QTextFormat::TableCellRightBorder) ||
                                 cell.format().hasProperty(QTextFormat::TableCellBottomBorder));

    if (!td->borderCollapse && td->border != 0 && !cellBorderConfigured) {
        const QBrush oldBrush = painter->brush();
        const QPen oldPen = painter->pen();

        // If border is configured for the table (and not explicitly for the cell), then
        // always draw 1px border around the cell
        const qreal border = 1;

        QRectF borderRect(cellRect.left() - border, cellRect.top() - border, cellRect.width() + border, cellRect.height() + border);

        // invert the border style for cells
        QTextFrameFormat::BorderStyle cellBorder = table->format().borderStyle();
        switch (cellBorder) {
        case QTextFrameFormat::BorderStyle_Inset:
            cellBorder = QTextFrameFormat::BorderStyle_Outset;
            break;
        case QTextFrameFormat::BorderStyle_Outset:
            cellBorder = QTextFrameFormat::BorderStyle_Inset;
            break;
        case QTextFrameFormat::BorderStyle_Groove:
            cellBorder = QTextFrameFormat::BorderStyle_Ridge;
            break;
        case QTextFrameFormat::BorderStyle_Ridge:
            cellBorder = QTextFrameFormat::BorderStyle_Groove;
            break;
        default:
            break;
        }

        drawBorder(painter, borderRect, topMargin, bottomMargin,
                   border, table->format().borderBrush(), cellBorder);

        painter->setBrush(oldBrush);
        painter->setPen(oldPen);
    }

    const QBrush bg = cell.format().background();
    const QPointF brushOrigin = painter->brushOrigin();
    if (bg.style() != Qt::NoBrush) {
        const qreal pageHeight = document->pageSize().height();
        const int topPage = pageHeight > 0 ? static_cast<int>(cellRect.top() / pageHeight) : 0;
        const int bottomPage = pageHeight > 0 ? static_cast<int>((cellRect.bottom()) / pageHeight) : 0;

        if (topPage == bottomPage)
            fillBackground(painter, cellRect, bg, cellRect.topLeft());
        else {
            for (int i = topPage; i <= bottomPage; ++i) {
                QRectF clipped = cellRect.toRect();

                if (topPage != bottomPage) {
                    const qreal top = qMax(i * pageHeight + topMargin, cell_context.clip.top());
                    const qreal bottom = qMin((i + 1) * pageHeight - bottomMargin, cell_context.clip.bottom());

                    clipped.setTop(qMax(clipped.top(), top));
                    clipped.setBottom(qMin(clipped.bottom(), bottom));

                    if (clipped.bottom() <= clipped.top())
                        continue;

                    fillBackground(painter, clipped, bg, cellRect.topLeft());
                }
            }
        }

        if (bg.style() > Qt::SolidPattern)
            painter->setBrushOrigin(cellRect.topLeft());
    }

    // paint over the background - otherwise we would have to adjust the background paint cellRect for the border values
    if (cellBorderConfigured)
        drawTableCellBorder(cellRect, painter, table, td, cell);

    const QFixed verticalOffset = td->cellVerticalOffsets.at(c + r * table->columns());

    const QPointF cellPos = QPointF(cellRect.left() + leftPadding.toReal(),
                                    cellRect.top() + (topPadding + verticalOffset).toReal());

    QTextBlock repaintBlock;
    drawFlow(cellPos, painter, cell_context, cell.begin(),
             td->childFrameMap.values(r + c * table->rows()),
             &repaintBlock);
    if (repaintBlock.isValid()) {
        *cursorBlockNeedingRepaint = repaintBlock;
        *cursorBlockOffset = cellPos;
    }

    if (bg.style() > Qt::SolidPattern)
        painter->setBrushOrigin(brushOrigin);
}